

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

void Pass5::run(Program *program,TailCallData *data)

{
  Function *pFVar1;
  Expression *pEVar2;
  Function *function;
  Pass5 pass5;
  undefined **local_38;
  Function *local_30;
  TailCallData *local_28;
  
  while (pFVar1 = program->first, pFVar1 != (Function *)0x0) {
    local_38 = &PTR_visit_int_literal_00155cb8;
    pEVar2 = (pFVar1->block).last;
    local_30 = pFVar1;
    local_28 = data;
    (*pEVar2->_vptr_Expression[2])(pEVar2,&local_38);
    program = (Program *)&pFVar1->next_function;
  }
  return;
}

Assistant:

static void run(const Program& program, TailCallData& data) {
		for (const Function* function: program) {
			Pass5 pass5(function, data);
			pass5.evaluate(function->get_block());
		}
	}